

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform::
IfcCartesianTransformationOperator3DnonUniform(IfcCartesianTransformationOperator3DnonUniform *this)

{
  *(undefined ***)&this->field_0xb8 = &PTR__Object_008f50b0;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(char **)&this->field_0xc8 = "IfcCartesianTransformationOperator3DnonUniform";
  IfcCartesianTransformationOperator3D::IfcCartesianTransformationOperator3D
            (&this->super_IfcCartesianTransformationOperator3D,&PTR_construction_vtable_24__009674c8
            );
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x90 = 0;
  (this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x9673e8;
  *(undefined8 *)&this->field_0xb8 = 0x9674b0;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x967410;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x967438;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    field_0x68 = 0x967460;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x88 = 0x967488;
  this->field_0xa0 = 0;
  (this->Scale3).have = false;
  return;
}

Assistant:

IfcCartesianTransformationOperator3DnonUniform() : Object("IfcCartesianTransformationOperator3DnonUniform") {}